

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void enet_host_bandwidth_throttle(ENetHost *host)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  enet_uint32 eVar4;
  uint uVar5;
  ENetPeer *pEVar6;
  uint uVar7;
  ENetPeer *pEVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  ENetProtocol command;
  ENetProtocol local_60;
  
  eVar4 = enet_time_get();
  uVar13 = eVar4 - host->bandwidthThrottleEpoch;
  if (999 < uVar13) {
    uVar15 = (uint)host->connectedPeers;
    uVar12 = (ulong)uVar15;
    host->bandwidthThrottleEpoch = eVar4;
    if (uVar15 != 0) {
      if (host->outgoingBandwidth == 0) {
        uVar14 = 0xffffffff;
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = (host->outgoingBandwidth * uVar13) / 1000;
        if ((long)host->peerCount < 1) {
          uVar14 = 0;
        }
        else {
          pEVar8 = host->peers;
          pEVar6 = pEVar8 + host->peerCount;
          uVar14 = 0;
          do {
            if (pEVar8->state - ENET_PEER_STATE_CONNECTED < 2) {
              uVar14 = (ulong)((int)uVar14 + pEVar8->outgoingDataTotal);
            }
            pEVar8 = pEVar8 + 1;
          } while (pEVar8 < pEVar6);
        }
      }
      if (host->bandwidthLimitedPeers == 0) {
        bVar16 = true;
      }
      else {
        pEVar8 = host->peers;
        sVar2 = host->peerCount;
        do {
          iVar10 = 0x20;
          if (uVar7 < (uint)uVar14) {
            iVar10 = (int)((uVar7 << 5) / uVar14);
          }
          bVar3 = false;
          pEVar6 = pEVar8;
          if (0 < (long)sVar2) {
            do {
              if (((pEVar6->state - ENET_PEER_STATE_CONNECTED < 2) &&
                  (pEVar6->incomingBandwidth != 0)) &&
                 (pEVar6->outgoingBandwidthThrottleEpoch != eVar4)) {
                uVar9 = pEVar6->incomingBandwidth * uVar13;
                uVar1 = pEVar6->outgoingDataTotal;
                if (uVar9 / 1000 < uVar1 * iVar10 >> 5) {
                  uVar11 = (uVar9 / 1000) * 0x20;
                  uVar5 = uVar11 / uVar1;
                  if (uVar11 < uVar1) {
                    uVar5 = 1;
                  }
                  pEVar6->packetThrottleLimit = uVar5;
                  if (uVar5 < pEVar6->packetThrottle) {
                    pEVar6->packetThrottle = uVar5;
                  }
                  pEVar6->outgoingBandwidthThrottleEpoch = eVar4;
                  pEVar6->incomingDataTotal = 0;
                  pEVar6->outgoingDataTotal = 0;
                  uVar15 = uVar15 - 1;
                  uVar7 = uVar7 - uVar9 / 1000;
                  uVar14 = (ulong)((int)uVar14 - uVar9 / 1000);
                  bVar3 = true;
                }
              }
              pEVar6 = pEVar6 + 1;
            } while (pEVar6 < pEVar8 + sVar2);
          }
          bVar16 = uVar15 != 0;
        } while ((bVar16) && (bVar3));
      }
      if (bVar16) {
        uVar13 = 0x20;
        if (uVar7 < (uint)uVar14) {
          uVar13 = (uint)((uVar7 << 5) / uVar14);
        }
        if (0 < (long)host->peerCount) {
          pEVar8 = host->peers;
          pEVar6 = pEVar8 + host->peerCount;
          do {
            if ((pEVar8->state - ENET_PEER_STATE_CONNECTED < 2) &&
               (pEVar8->outgoingBandwidthThrottleEpoch != eVar4)) {
              pEVar8->packetThrottleLimit = uVar13;
              if (uVar13 < pEVar8->packetThrottle) {
                pEVar8->packetThrottle = uVar13;
              }
              pEVar8->incomingDataTotal = 0;
              pEVar8->outgoingDataTotal = 0;
            }
            pEVar8 = pEVar8 + 1;
          } while (pEVar8 < pEVar6);
        }
      }
      if (host->recalculateBandwidthLimits != 0) {
        host->recalculateBandwidthLimits = 0;
        uVar14 = (ulong)host->incomingBandwidth;
        if (host->incomingBandwidth == 0) {
          uVar13 = 0;
        }
        else {
          pEVar8 = host->peers;
          sVar2 = host->peerCount;
          do {
            bVar16 = false;
            uVar13 = (uint)(uVar14 / uVar12);
            pEVar6 = pEVar8;
            if (0 < (long)sVar2) {
              do {
                if (((pEVar6->state - ENET_PEER_STATE_CONNECTED < 2) &&
                    (pEVar6->incomingBandwidthThrottleEpoch != eVar4)) &&
                   ((uVar15 = pEVar6->outgoingBandwidth, uVar15 == 0 || (uVar15 < uVar13)))) {
                  pEVar6->incomingBandwidthThrottleEpoch = eVar4;
                  uVar12 = (ulong)((int)uVar12 - 1);
                  uVar14 = (ulong)((int)uVar14 - uVar15);
                  bVar16 = true;
                }
                pEVar6 = pEVar6 + 1;
              } while (pEVar6 < pEVar8 + sVar2);
            }
          } while (((int)uVar12 != 0) && (bVar16));
        }
        if (0 < (long)host->peerCount) {
          pEVar8 = host->peers;
          do {
            if (pEVar8->state - ENET_PEER_STATE_CONNECTED < 2) {
              local_60._0_2_ = 0xff8a;
              uVar15 = host->outgoingBandwidth;
              local_60.connect.mtu =
                   uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18;
              local_60.disconnect.data =
                   uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
              if (pEVar8->incomingBandwidthThrottleEpoch == eVar4) {
                uVar15 = pEVar8->outgoingBandwidth;
                local_60.disconnect.data =
                     uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18;
              }
              enet_peer_queue_outgoing_command(pEVar8,&local_60,(ENetPacket *)0x0,0,0);
            }
            pEVar8 = pEVar8 + 1;
          } while (pEVar8 < host->peers + host->peerCount);
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
            ++ peer)
        {
            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            enet_uint32 peerBandwidth;
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peer -> packetThrottleLimit = throttle;

            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
        }
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

           for (peer = host -> peers;
                peer < & host -> peers [host -> peerCount];
                ++ peer)
           {
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (peer = host -> peers;
            peer < & host -> peers [host -> peerCount];
            ++ peer)
       {
           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}